

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O3

int64_t __thiscall
duckdb::LocalFileSystem::Write
          (LocalFileSystem *this,FileHandle *handle,void *buffer,int64_t nr_bytes)

{
  int __fd;
  pointer pcVar1;
  bool bVar2;
  ssize_t sVar3;
  IOException *this_00;
  int *piVar4;
  char *params_1;
  size_t __n;
  ulong uVar5;
  int64_t iVar6;
  undefined1 local_10b;
  undefined1 local_10a;
  undefined1 local_109;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  string local_c8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_68;
  
  if (nr_bytes < 1) {
    iVar6 = 0;
  }
  else {
    __fd = *(int *)&handle[1]._vptr_FileHandle;
    iVar6 = 0;
    do {
      __n = 0x7fffffff;
      if ((ulong)nr_bytes < 0x7fffffff) {
        __n = nr_bytes;
      }
      sVar3 = ::write(__fd,buffer,__n);
      if (sVar3 < 1) {
        this_00 = (IOException *)__cxa_allocate_exception(0x10);
        local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_108,"Could not write file \"%s\": %s","");
        piVar4 = __errno_location();
        std::__cxx11::to_string(&local_c8,*piVar4);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (&local_a8,(char (*) [6])"errno",&local_c8);
        ::std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&local_68,&local_a8,&local_68,0,&local_109,&local_10a,&local_10b);
        local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
        pcVar1 = (handle->path)._M_dataplus._M_p;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_e8,pcVar1,pcVar1 + (handle->path)._M_string_length);
        params_1 = strerror(*piVar4);
        IOException::IOException<std::__cxx11::string,char*>
                  (this_00,&local_108,&local_68,&local_e8,params_1);
        __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
      iVar6 = iVar6 + sVar3;
      buffer = (void *)((long)buffer + sVar3);
      uVar5 = nr_bytes - sVar3;
      bVar2 = sVar3 <= nr_bytes;
      nr_bytes = uVar5;
    } while (uVar5 != 0 && bVar2);
  }
  return iVar6;
}

Assistant:

int64_t LocalFileSystem::Write(FileHandle &handle, void *buffer, int64_t nr_bytes) {
	int fd = handle.Cast<UnixFileHandle>().fd;
	int64_t bytes_written = 0;
	while (nr_bytes > 0) {
		auto bytes_to_write = MinValue<idx_t>(idx_t(NumericLimits<int32_t>::Maximum()), idx_t(nr_bytes));
		int64_t current_bytes_written = write(fd, buffer, bytes_to_write);
		if (current_bytes_written <= 0) {
			throw IOException("Could not write file \"%s\": %s", {{"errno", std::to_string(errno)}}, handle.path,
			                  strerror(errno));
		}
		bytes_written += current_bytes_written;
		buffer = (void *)(data_ptr_cast(buffer) + current_bytes_written);
		nr_bytes -= current_bytes_written;
	}
	return bytes_written;
}